

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_string_primitive_withoutSuffix
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_object_tuple_t *psVar1;
  ulong uVar2;
  int iVar3;
  sysbvm_object_tuple_t *psVar4;
  ulong __n;
  ulong uVar5;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = (sysbvm_object_tuple_t *)*arguments;
  uVar2 = arguments[1];
  psVar4 = psVar1;
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    __n = (ulong)*(uint *)(uVar2 + 0xc);
    if (__n != 0) {
      if (((ulong)psVar1 & 0xf) == 0 && psVar1 != (sysbvm_object_tuple_t *)0x0) {
        uVar5 = (ulong)(psVar1->header).objectSize;
      }
      else {
        uVar5 = 0;
      }
      if (*(uint *)(uVar2 + 0xc) <= (uint)uVar5) {
        iVar3 = bcmp((void *)((long)psVar1 + ((uVar5 + 0x10) - __n)),(void *)(uVar2 + 0x10),__n);
        if (iVar3 == 0) {
          psVar4 = sysbvm_context_allocateByteTuple(context,(context->roots).stringType,uVar5 - __n)
          ;
          if (psVar4 == (sysbvm_object_tuple_t *)0x0) {
            psVar4 = (sysbvm_object_tuple_t *)0x0;
          }
          else {
            memcpy(&psVar4->field_1,&psVar1->field_1,uVar5 - __n);
          }
        }
      }
    }
  }
  return (sysbvm_tuple_t)psVar4;
}

Assistant:

static sysbvm_tuple_t sysbvm_string_primitive_withoutSuffix(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t string = arguments[0];
    sysbvm_tuple_t suffix = arguments[1];

    size_t suffixLen = sysbvm_tuple_getSizeInBytes(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    if(stringSize < suffixLen)
        return string;
    
    uint8_t *suffixData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(suffix)->bytes;
    uint8_t *stringData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    if(memcmp(stringData + stringSize - suffixLen, suffixData, suffixLen))
        return string;

    return sysbvm_string_createWithString(context, stringSize - suffixLen, (const char*)(stringData));
}